

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmaes.cpp
# Opt level: O3

void __thiscall Cmaes::Cmaes(Cmaes *this)

{
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CMAES","");
  (this->super_Optimizer)._vptr_Optimizer = (_func_int **)&PTR___cxa_pure_virtual_0013ad50;
  (this->super_Optimizer).type = CMAES;
  (this->super_Optimizer).name._M_dataplus._M_p = (pointer)&(this->super_Optimizer).name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Optimizer).name,local_40,local_40 + local_38);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  (this->super_Optimizer)._vptr_Optimizer = (_func_int **)&PTR_getName_abi_cxx11__0013ace8;
  memset(&this->xmean,0,0x108);
  return;
}

Assistant:

Cmaes::Cmaes(void) : Optimizer("CMAES", CMAES) 
{
}